

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O0

Addr * hwnet::Addr::MakeBySockAddr(Addr *__return_storage_ptr__,sockaddr *addr_,socklen_t len)

{
  Addr *addr;
  socklen_t len_local;
  sockaddr *addr__local;
  
  Addr(__return_storage_ptr__);
  memset(__return_storage_ptr__,0,0x70);
  if (len == 0x10) {
    __return_storage_ptr__->family = 2;
    __return_storage_ptr__->addrType = 1;
    *(undefined8 *)&__return_storage_ptr__->sockaddr = *(undefined8 *)addr_;
    *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 8) =
         *(undefined8 *)(addr_->sa_data + 6);
  }
  else if (len == 0x1c) {
    __return_storage_ptr__->family = 10;
    __return_storage_ptr__->addrType = 2;
    *(undefined8 *)&__return_storage_ptr__->sockaddr = *(undefined8 *)addr_;
    *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 8) =
         *(undefined8 *)(addr_->sa_data + 6);
    *(undefined8 *)((long)&__return_storage_ptr__->sockaddr + 0x10) = *(undefined8 *)(addr_ + 1);
    (__return_storage_ptr__->sockaddr).in6.sin6_scope_id = *(uint32_t *)(addr_[1].sa_data + 6);
  }
  else if (len == 0x6e) {
    __return_storage_ptr__->family = 1;
    __return_storage_ptr__->addrType = 3;
    memcpy(__return_storage_ptr__,addr_,0x6e);
  }
  else {
    __return_storage_ptr__->addrType = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

static Addr MakeBySockAddr(struct sockaddr *addr_,socklen_t len) {
        Addr addr;
        memset(&addr.sockaddr,0,sizeof(addr.sockaddr));
        if(len == sizeof(addr.sockaddr.in)){
            addr.family   = AF_INET;
            addr.addrType = SOCK_ADDR_IPV4;
            addr.sockaddr.in = *((struct sockaddr_in*)addr_);
        } else if(len == sizeof(addr.sockaddr.in6)){
            addr.family   = AF_INET6;
            addr.addrType = SOCK_ADDR_IPV6;
            addr.sockaddr.in6 = *((struct sockaddr_in6*)addr_);
        } else if(len == sizeof(addr.sockaddr.un)){
            addr.family   = AF_UNIX;            
            addr.addrType = SOCK_ADDR_UNIX;
            addr.sockaddr.un = *((struct sockaddr_un*)addr_);
        } else {
            addr.addrType = SOCK_ADDR_EMPTY;
        }
        return addr;
    }